

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmNinjaTargetGenerator.cxx
# Opt level: O2

void __thiscall cmNinjaTargetGenerator::WriteCompileRule(cmNinjaTargetGenerator *this,string *lang)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  cmMakefile *this_00;
  cmLocalNinjaGenerator *pcVar2;
  cmGeneratorTarget *pcVar3;
  pointer pbVar4;
  size_type sVar5;
  bool bVar6;
  TargetType targetType;
  string *psVar7;
  undefined4 extraout_var;
  char *pcVar8;
  cmGlobalNinjaGenerator *pcVar9;
  char *__s;
  char *__s_00;
  char *__s_01;
  cmOutputConverter *pcVar10;
  string *i_1;
  _Alloc_hider str;
  string *i;
  pointer pbVar11;
  string *i_2;
  allocator<char> local_5db;
  char local_5da;
  char local_5d9;
  string ppVar;
  allocator<char> local_5b1;
  string compilerLauncher;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ppCmds;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  compileCmds;
  string local_550;
  string local_530;
  unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
  rulePlaceholderExpander;
  string cpplint_prop;
  string run_iwyu;
  string local_4c8;
  string responseFlag;
  string flags;
  string cppcheck_prop;
  string launcher;
  string cmakeCmd;
  string cldeps;
  cmNinjaRule rule;
  string tdi;
  string local_1a8;
  string local_188;
  string local_168;
  RuleVariables local_148;
  
  cmRulePlaceholderExpander::RuleVariables::RuleVariables(&local_148);
  psVar7 = cmGeneratorTarget::GetName_abi_cxx11_
                     ((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_148.CMTargetName = (psVar7->_M_dataplus)._M_p;
  targetType = cmGeneratorTarget::GetType((this->super_cmCommonTargetGenerator).GeneratorTarget);
  local_148.CMTargetType = cmState::GetTargetTypeName(targetType);
  local_148.Language = (lang->_M_dataplus)._M_p;
  local_148.Source = "$in";
  local_148.Object = "$out";
  local_148.Defines = "$DEFINES";
  local_148.Includes = "$INCLUDES";
  local_148.TargetPDB = "$TARGET_PDB";
  local_148.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  local_148.ObjectDir = "$OBJECT_DIR";
  local_148.ObjectFileDir = "$OBJECT_FILE_DIR";
  local_5d9 = std::operator==(lang,"Fortran");
  local_5da = std::operator==(lang,"Fortran");
  this_00 = (this->super_cmCommonTargetGenerator).Makefile;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&flags,"$FLAGS",(allocator<char> *)&rule);
  responseFlag._M_dataplus._M_p = (pointer)&responseFlag.field_2;
  responseFlag._M_string_length = 0;
  responseFlag.field_2._M_local_buf[0] = '\0';
  bVar6 = std::operator!=(lang,"RC");
  if ((bVar6) && (bVar6 = ForceResponseFile(this), bVar6)) {
    std::operator+(&cldeps,"CMAKE_",lang);
    std::operator+(&rule.Name,&cldeps,"_RESPONSE_FILE_FLAG");
    std::__cxx11::string::~string((string *)&cldeps);
    cmMakefile::GetSafeDefinition((this->super_cmCommonTargetGenerator).Makefile,&rule.Name);
    std::__cxx11::string::_M_assign((string *)&responseFlag);
    if ((responseFlag._M_string_length == 0) && (bVar6 = std::operator!=(lang,"CUDA"), bVar6)) {
      std::__cxx11::string::assign((char *)&responseFlag);
    }
    std::__cxx11::string::~string((string *)&rule);
  }
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._0_4_ =
       (*(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
         _vptr_cmLocalGenerator[5])();
  rulePlaceholderExpander._M_t.
  super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>.
  _M_t.
  super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
  .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl._4_4_ = extraout_var;
  pcVar2 = this->LocalGenerator;
  GetTargetDependInfoPath(&cldeps,this,lang);
  ConvertToNinjaPath(&rule.Name,this,&cldeps);
  cmOutputConverter::ConvertToOutputFormat
            (&tdi,&(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                   super_cmOutputConverter,&rule.Name,SHELL);
  std::__cxx11::string::~string((string *)&rule);
  std::__cxx11::string::~string((string *)&cldeps);
  launcher._M_dataplus._M_p = (pointer)&launcher.field_2;
  launcher._M_string_length = 0;
  launcher.field_2._M_local_buf[0] = '\0';
  pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
  pcVar2 = this->LocalGenerator;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&rule,"RULE_LAUNCH_COMPILE",(allocator<char> *)&cldeps);
  pcVar8 = cmLocalGenerator::GetRuleLauncher((cmLocalGenerator *)pcVar2,pcVar3,&rule.Name);
  std::__cxx11::string::~string((string *)&rule);
  if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
    std::__cxx11::string::assign((char *)&launcher);
    std::__cxx11::string::append((char *)&launcher);
  }
  pcVar2 = this->LocalGenerator;
  psVar7 = cmSystemTools::GetCMakeCommand_abi_cxx11_();
  cmOutputConverter::ConvertToOutputFormat
            (&cmakeCmd,
             &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.super_cmOutputConverter,
             psVar7,SHELL);
  if (local_5d9 != '\0') {
    LanguagePreprocessRule(&local_168,this,lang);
    cmNinjaRule::cmNinjaRule(&rule,&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::assign((char *)&rule.DepType);
    std::__cxx11::string::assign((char *)&rule.DepFile);
    cmRulePlaceholderExpander::RuleVariables::RuleVariables((RuleVariables *)&cldeps);
    cldeps._M_dataplus._M_p = local_148.CMTargetName;
    cldeps._M_string_length = (size_type)local_148.CMTargetType;
    local_148.Source = "$in";
    std::__cxx11::string::string((string *)&compilerLauncher,(string *)&flags);
    local_148.Defines = "";
    if (responseFlag._M_string_length != 0) {
      std::__cxx11::string::assign((char *)&rule.RspFile);
      psVar7 = &rule.RspContent;
      std::__cxx11::string::assign((char *)psVar7);
      std::__cxx11::string::append((char *)psVar7);
      std::__cxx11::string::append((char *)psVar7);
      std::__cxx11::string::append((char *)psVar7);
      std::__cxx11::string::append((char *)psVar7);
      std::__cxx11::string::append((string *)psVar7);
      std::operator+(&ppVar,&responseFlag,&rule.RspFile);
      std::__cxx11::string::operator=((string *)&compilerLauncher,(string *)&ppVar);
      std::__cxx11::string::~string((string *)&ppVar);
    }
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    ppCmds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    std::operator+(&ppVar,"CMAKE_",lang);
    std::__cxx11::string::append((char *)&ppVar);
    psVar7 = cmMakefile::GetRequiredDefinition
                       ((this->super_cmCommonTargetGenerator).Makefile,&ppVar);
    cmSystemTools::ExpandListArgument(psVar7,&ppCmds,false);
    std::__cxx11::string::~string((string *)&ppVar);
    pbVar4 = ppCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (pbVar11 = ppCmds.
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar4;
        pbVar11 = pbVar11 + 1) {
      std::operator+(&ppVar,&launcher,pbVar11);
      std::__cxx11::string::operator=((string *)pbVar11,(string *)&ppVar);
      std::__cxx11::string::~string((string *)&ppVar);
      pcVar10 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                 super_cmOutputConverter;
      if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
        pcVar10 = (cmOutputConverter *)0x0;
      }
      cmRulePlaceholderExpander::ExpandRuleVariables
                ((cmRulePlaceholderExpander *)
                 rulePlaceholderExpander._M_t.
                 super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
                 .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,pcVar10,
                 pbVar11,(RuleVariables *)&cldeps);
    }
    std::__cxx11::string::string((string *)&ppVar,(string *)&cmakeCmd);
    std::__cxx11::string::append((char *)&ppVar);
    std::__cxx11::string::append((string *)&ppVar);
    std::__cxx11::string::append((char *)&ppVar);
    std::__cxx11::string::append((string *)&ppVar);
    std::__cxx11::string::append((char *)&ppVar);
    if (local_5da != '\0') {
      std::__cxx11::string::append((char *)&ppVar);
    }
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ppCmds,&ppVar);
    std::__cxx11::string::~string((string *)&ppVar);
    local_530._M_dataplus._M_p = (pointer)&local_530.field_2;
    local_530._M_string_length = 0;
    local_530.field_2._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&ppVar,this->LocalGenerator,&ppCmds,&local_530,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&rule.Command,(string *)&ppVar);
    std::__cxx11::string::~string((string *)&ppVar);
    std::__cxx11::string::~string((string *)&local_530);
    psVar7 = &rule.Comment;
    std::__cxx11::string::assign((char *)psVar7);
    std::__cxx11::string::append((string *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    psVar7 = &rule.Description;
    std::__cxx11::string::assign((char *)psVar7);
    std::__cxx11::string::append((string *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    pcVar9 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddRule(pcVar9,&rule);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector(&ppCmds);
    std::__cxx11::string::~string((string *)&compilerLauncher);
    cmNinjaRule::~cmNinjaRule(&rule);
  }
  if (local_5da != '\0') {
    LanguageDyndepRule(&local_188,this,lang);
    cmNinjaRule::cmNinjaRule(&rule,&local_188);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::assign((char *)&rule.RspFile);
    std::__cxx11::string::assign((char *)&rule.RspContent);
    ppVar._M_dataplus._M_p = (pointer)0x0;
    ppVar._M_string_length = 0;
    ppVar.field_2._M_allocated_capacity = 0;
    std::__cxx11::string::string((string *)&cldeps,(string *)&cmakeCmd);
    std::__cxx11::string::append((char *)&cldeps);
    std::__cxx11::string::append((string *)&cldeps);
    std::__cxx11::string::append((char *)&cldeps);
    std::__cxx11::string::append((string *)&cldeps);
    std::__cxx11::string::append((char *)&cldeps);
    std::__cxx11::string::append((char *)&cldeps);
    std::__cxx11::string::append((string *)&cldeps);
    std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
    emplace_back<std::__cxx11::string>
              ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&ppVar,&cldeps);
    std::__cxx11::string::~string((string *)&cldeps);
    compilerLauncher._M_dataplus._M_p = (pointer)&compilerLauncher.field_2;
    compilerLauncher._M_string_length = 0;
    compilerLauncher.field_2._M_local_buf[0] = '\0';
    cmLocalNinjaGenerator::BuildCommandLine
              (&cldeps,this->LocalGenerator,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&ppVar,&compilerLauncher,(cmGeneratorTarget *)0x0);
    std::__cxx11::string::operator=((string *)&rule.Command,(string *)&cldeps);
    std::__cxx11::string::~string((string *)&cldeps);
    std::__cxx11::string::~string((string *)&compilerLauncher);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&ppVar);
    psVar7 = &rule.Comment;
    std::__cxx11::string::assign((char *)psVar7);
    std::__cxx11::string::append((string *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    psVar7 = &rule.Description;
    std::__cxx11::string::assign((char *)psVar7);
    std::__cxx11::string::append((string *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    pcVar9 = GetGlobalGenerator(this);
    cmGlobalNinjaGenerator::AddRule(pcVar9,&rule);
    cmNinjaRule::~cmNinjaRule(&rule);
  }
  LanguageCompilerRule(&local_1a8,this,lang);
  cmNinjaRule::cmNinjaRule(&rule,&local_1a8);
  std::__cxx11::string::~string((string *)&local_1a8);
  if (responseFlag._M_string_length != 0) {
    std::__cxx11::string::assign((char *)&rule.RspFile);
    psVar7 = &rule.RspContent;
    std::__cxx11::string::assign((char *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    std::__cxx11::string::append((char *)psVar7);
    std::__cxx11::string::append((string *)psVar7);
    std::operator+(&cldeps,&responseFlag,&rule.RspFile);
    std::__cxx11::string::operator=((string *)&flags,(string *)&cldeps);
    std::__cxx11::string::~string((string *)&cldeps);
    local_148.Defines = "";
    local_148.Includes = "";
  }
  cldeps._M_dataplus._M_p = (pointer)&cldeps.field_2;
  cldeps._M_string_length = 0;
  cldeps.field_2._M_local_buf[0] = '\0';
  if (local_5d9 == '\0') {
    bVar6 = NeedDepTypeMSVC(this,lang);
    if (bVar6) {
      std::__cxx11::string::assign((char *)&rule.DepType);
      rule.DepFile._M_string_length = 0;
      *rule.DepFile._M_dataplus._M_p = '\0';
      std::__cxx11::string::append((char *)&flags);
    }
    else {
      std::operator+(&compilerLauncher,"CMAKE_NINJA_CMCLDEPS_",lang);
      bVar6 = cmMakefile::IsOn(this_00,&compilerLauncher);
      std::__cxx11::string::~string((string *)&compilerLauncher);
      if (bVar6) {
        bVar6 = cmMakefile::GetIsSourceFileTryCompile(this_00);
        if (bVar6) goto LAB_0022847b;
        std::__cxx11::string::assign((char *)&rule.DepType);
        std::__cxx11::string::assign((char *)&rule.DepFile);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ppVar,"CMAKE_C_COMPILER",(allocator<char> *)&ppCmds);
        pcVar8 = cmMakefile::GetDefinition(this_00,&ppVar);
        if (pcVar8 == (char *)0x0) {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_530,"CMAKE_CXX_COMPILER",&local_5b1);
          psVar7 = cmMakefile::GetSafeDefinition(this_00,&local_530);
        }
        else {
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_530,"CMAKE_C_COMPILER",&local_5b1);
          psVar7 = cmMakefile::GetSafeDefinition(this_00,&local_530);
        }
        std::__cxx11::string::string((string *)&compilerLauncher,(string *)psVar7);
        std::__cxx11::string::~string((string *)&local_530);
        std::__cxx11::string::~string((string *)&ppVar);
        std::__cxx11::string::assign((char *)&cldeps);
        cmSystemTools::GetCMClDepsCommand_abi_cxx11_();
        std::__cxx11::string::append((string *)&cldeps);
        std::operator+(&cppcheck_prop,"\" ",lang);
        std::operator+(&cpplint_prop,&cppcheck_prop," ");
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppCmds,
                       &cpplint_prop,local_148.Source);
        std::operator+(&ppVar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ppCmds," $DEP_FILE $out \"");
        std::__cxx11::string::append((string *)&cldeps);
        std::__cxx11::string::~string((string *)&ppVar);
        std::__cxx11::string::~string((string *)&ppCmds);
        std::__cxx11::string::~string((string *)&cpplint_prop);
        std::__cxx11::string::~string((string *)&cppcheck_prop);
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&ppVar,"CMAKE_CL_SHOWINCLUDES_PREFIX",(allocator<char> *)&ppCmds);
        cmMakefile::GetSafeDefinition(this_00,&ppVar);
        std::__cxx11::string::append((string *)&cldeps);
        std::__cxx11::string::~string((string *)&ppVar);
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppCmds,
                       "\" \"",&compilerLauncher);
        std::operator+(&ppVar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                              &ppCmds,"\" ");
        std::__cxx11::string::append((string *)&cldeps);
        std::__cxx11::string::~string((string *)&ppVar);
        psVar7 = (string *)&ppCmds;
      }
      else {
        std::__cxx11::string::assign((char *)&rule.DepType);
        std::__cxx11::string::assign((char *)&rule.DepFile);
        std::operator+(&compilerLauncher,"CMAKE_DEPFILE_FLAGS_",lang);
        psVar7 = cmMakefile::GetSafeDefinition(this_00,&compilerLauncher);
        std::__cxx11::string::string((string *)&ppVar,(string *)psVar7);
        if (ppVar._M_string_length != 0) {
          cmsys::SystemTools::ReplaceString(&ppVar,"<DEPFILE>","$DEP_FILE");
          cmsys::SystemTools::ReplaceString(&ppVar,"<OBJECT>","$out");
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_530,"CMAKE_C_COMPILER",(allocator<char> *)&ppCmds);
          pcVar8 = cmMakefile::GetDefinition(this_00,&local_530);
          cmsys::SystemTools::ReplaceString(&ppVar,"<CMAKE_C_COMPILER>",pcVar8);
          std::__cxx11::string::~string((string *)&local_530);
          std::operator+(&local_530," ",&ppVar);
          std::__cxx11::string::append((string *)&flags);
          std::__cxx11::string::~string((string *)&local_530);
        }
        psVar7 = &ppVar;
      }
      std::__cxx11::string::~string((string *)psVar7);
      std::__cxx11::string::~string((string *)&compilerLauncher);
    }
  }
LAB_0022847b:
  local_148.Flags = flags._M_dataplus._M_p;
  local_148.DependencyFile = rule.DepFile._M_dataplus._M_p;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  compileCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  bVar6 = std::operator==(lang,"CUDA");
  paVar1 = &compilerLauncher.field_2;
  if (bVar6) {
    compilerLauncher._M_string_length = 0;
    compilerLauncher.field_2._M_local_buf[0] = '\0';
    pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
    compilerLauncher._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ppVar,"CUDA_SEPARABLE_COMPILATION",(allocator<char> *)&ppCmds);
    bVar6 = cmGeneratorTarget::GetPropertyAsBool(pcVar3,&ppVar);
    std::__cxx11::string::~string((string *)&ppVar);
    if (!bVar6) {
      pcVar3 = (this->super_cmCommonTargetGenerator).GeneratorTarget;
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ppVar,"CUDA_PTX_COMPILATION",(allocator<char> *)&ppCmds);
      cmGeneratorTarget::GetPropertyAsBool(pcVar3,&ppVar);
      std::__cxx11::string::~string((string *)&ppVar);
    }
    std::__cxx11::string::assign((char *)&compilerLauncher);
    psVar7 = cmMakefile::GetRequiredDefinition(this_00,&compilerLauncher);
    cmSystemTools::ExpandListArgument(psVar7,&compileCmds,false);
  }
  else {
    std::operator+(&ppVar,"CMAKE_",lang);
    std::operator+(&compilerLauncher,&ppVar,"_COMPILE_OBJECT");
    std::__cxx11::string::~string((string *)&ppVar);
    psVar7 = cmMakefile::GetRequiredDefinition(this_00,&compilerLauncher);
    cmSystemTools::ExpandListArgument(psVar7,&compileCmds,false);
  }
  std::__cxx11::string::~string((string *)&compilerLauncher);
  compilerLauncher._M_string_length = 0;
  compilerLauncher.field_2._M_local_buf[0] = '\0';
  compilerLauncher._M_dataplus._M_p = (pointer)paVar1;
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((((bVar6 = std::operator==(lang,"C"), bVar6 || (bVar6 = std::operator==(lang,"CXX"), bVar6))
       || (bVar6 = std::operator==(lang,"Fortran"), bVar6)) ||
      (bVar6 = std::operator==(lang,"CUDA"), bVar6)))) {
    std::operator+(&ppVar,lang,"_COMPILER_LAUNCHER");
    pcVar8 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,&ppVar);
    if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
      std::__cxx11::string::assign((char *)&compilerLauncher);
    }
    std::__cxx11::string::~string((string *)&ppVar);
  }
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) &&
     ((bVar6 = std::operator==(lang,"C"), bVar6 || (bVar6 = std::operator==(lang,"CXX"), bVar6)))) {
    std::operator+(&ppVar,lang,"_INCLUDE_WHAT_YOU_USE");
    pcVar8 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,&ppVar);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&ppCmds,lang
                   ,"_CLANG_TIDY");
    __s = cmGeneratorTarget::GetProperty
                    ((this->super_cmCommonTargetGenerator).GeneratorTarget,(string *)&ppCmds);
    std::operator+(&cpplint_prop,lang,"_CPPLINT");
    __s_00 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,&cpplint_prop);
    std::operator+(&cppcheck_prop,lang,"_CPPCHECK");
    __s_01 = cmGeneratorTarget::GetProperty
                       ((this->super_cmCommonTargetGenerator).GeneratorTarget,&cppcheck_prop);
    if (((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) ||
       ((((__s != (char *)0x0 && (*__s != '\0')) || ((__s_00 != (char *)0x0 && (*__s_00 != '\0'))))
        || ((__s_01 != (char *)0x0 && (*__s_01 != '\0')))))) {
      std::__cxx11::string::string((string *)&run_iwyu,(string *)&cmakeCmd);
      std::__cxx11::string::append((char *)&run_iwyu);
      if (compilerLauncher._M_string_length != 0) {
        std::__cxx11::string::append((char *)&run_iwyu);
        cmOutputConverter::EscapeForShell
                  (&local_550,
                   &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&compilerLauncher,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_550);
        compilerLauncher._M_string_length = 0;
        *compilerLauncher._M_dataplus._M_p = '\0';
      }
      if ((pcVar8 != (char *)0x0) && (*pcVar8 != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar2 = this->LocalGenerator;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,pcVar8,&local_5db);
        cmOutputConverter::EscapeForShell
                  (&local_550,
                   &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_4c8,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      if ((__s != (char *)0x0) && (*__s != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar2 = this->LocalGenerator;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,__s,&local_5db);
        cmOutputConverter::EscapeForShell
                  (&local_550,
                   &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_4c8,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      if ((__s_00 != (char *)0x0) && (*__s_00 != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar2 = this->LocalGenerator;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,__s_00,&local_5db);
        cmOutputConverter::EscapeForShell
                  (&local_550,
                   &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_4c8,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      if ((__s_01 != (char *)0x0) && (*__s_01 != '\0')) {
        std::__cxx11::string::append((char *)&run_iwyu);
        pcVar2 = this->LocalGenerator;
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_4c8,__s_01,&local_5db);
        cmOutputConverter::EscapeForShell
                  (&local_550,
                   &(pcVar2->super_cmLocalCommonGenerator).super_cmLocalGenerator.
                    super_cmOutputConverter,&local_4c8,false,false,false);
        std::__cxx11::string::append((string *)&run_iwyu);
        std::__cxx11::string::~string((string *)&local_550);
        std::__cxx11::string::~string((string *)&local_4c8);
      }
      if ((((__s != (char *)0x0) && (*__s != '\0')) ||
          ((__s_00 != (char *)0x0 && (*__s_00 != '\0')))) ||
         ((__s_01 != (char *)0x0 && (*__s_01 != '\0')))) {
        std::__cxx11::string::append((char *)&run_iwyu);
      }
      std::__cxx11::string::append((char *)&run_iwyu);
      std::__cxx11::string::insert
                ((ulong)compileCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,(string *)0x0);
      std::__cxx11::string::~string((string *)&run_iwyu);
    }
    std::__cxx11::string::~string((string *)&cppcheck_prop);
    std::__cxx11::string::~string((string *)&cpplint_prop);
    std::__cxx11::string::~string((string *)&ppCmds);
    std::__cxx11::string::~string((string *)&ppVar);
  }
  if ((compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start !=
       compileCmds.
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish) && (compilerLauncher._M_string_length != 0)) {
    cpplint_prop._M_dataplus._M_p = (pointer)0x0;
    cpplint_prop._M_string_length = 0;
    cpplint_prop.field_2._M_allocated_capacity = 0;
    cmSystemTools::ExpandListArgument
              (&compilerLauncher,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cpplint_prop,true);
    if (cpplint_prop._M_dataplus._M_p != (pointer)cpplint_prop._M_string_length) {
      cmOutputConverter::ConvertToOutputFormat
                (&ppVar,&(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator
                         .super_cmOutputConverter,(string *)cpplint_prop._M_dataplus._M_p,SHELL);
      std::__cxx11::string::operator=((string *)cpplint_prop._M_dataplus._M_p,(string *)&ppVar);
      std::__cxx11::string::~string((string *)&ppVar);
      sVar5 = cpplint_prop._M_string_length;
      str = cpplint_prop._M_dataplus;
      while (str._M_p = str._M_p + 0x20, str._M_p != (pointer)sVar5) {
        cmOutputConverter::EscapeForShell
                  (&ppVar,&(this->LocalGenerator->super_cmLocalCommonGenerator).
                           super_cmLocalGenerator.super_cmOutputConverter,(string *)str._M_p,false,
                   false,false);
        std::__cxx11::string::operator=((string *)str._M_p,(string *)&ppVar);
        std::__cxx11::string::~string((string *)&ppVar);
      }
    }
    pbVar4 = compileCmds.
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start;
    cmJoin<std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>
              ((string *)&ppCmds,
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)&cpplint_prop," ");
    std::operator+(&ppVar,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &ppCmds," ");
    std::__cxx11::string::insert((ulong)pbVar4,(string *)0x0);
    std::__cxx11::string::~string((string *)&ppVar);
    std::__cxx11::string::~string((string *)&ppCmds);
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&cpplint_prop);
  }
  if (compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      compileCmds.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::__cxx11::string::insert
              ((ulong)compileCmds.
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,(string *)0x0);
  }
  pbVar4 = compileCmds.
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pbVar11 = compileCmds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start; pbVar11 != pbVar4; pbVar11 = pbVar11 + 1
      ) {
    std::operator+(&ppVar,&launcher,pbVar11);
    std::__cxx11::string::operator=((string *)pbVar11,(string *)&ppVar);
    std::__cxx11::string::~string((string *)&ppVar);
    pcVar10 = &(this->LocalGenerator->super_cmLocalCommonGenerator).super_cmLocalGenerator.
               super_cmOutputConverter;
    if (this->LocalGenerator == (cmLocalNinjaGenerator *)0x0) {
      pcVar10 = (cmOutputConverter *)0x0;
    }
    cmRulePlaceholderExpander::ExpandRuleVariables
              ((cmRulePlaceholderExpander *)
               rulePlaceholderExpander._M_t.
               super___uniq_ptr_impl<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>
               ._M_t.
               super__Tuple_impl<0UL,_cmRulePlaceholderExpander_*,_std::default_delete<cmRulePlaceholderExpander>_>
               .super__Head_base<0UL,_cmRulePlaceholderExpander_*,_false>._M_head_impl,pcVar10,
               pbVar11,&local_148);
  }
  ppCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start =
       (pointer)&ppCmds.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
  ppCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  ppCmds.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage =
       (pointer)((ulong)ppCmds.
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_end_of_storage & 0xffffffffffffff00);
  cmLocalNinjaGenerator::BuildCommandLine
            (&ppVar,this->LocalGenerator,&compileCmds,(string *)&ppCmds,(cmGeneratorTarget *)0x0);
  std::__cxx11::string::operator=((string *)&rule.Command,(string *)&ppVar);
  std::__cxx11::string::~string((string *)&ppVar);
  std::__cxx11::string::~string((string *)&ppCmds);
  psVar7 = &rule.Comment;
  std::__cxx11::string::assign((char *)psVar7);
  std::__cxx11::string::append((string *)psVar7);
  std::__cxx11::string::append((char *)psVar7);
  psVar7 = &rule.Description;
  std::__cxx11::string::assign((char *)psVar7);
  std::__cxx11::string::append((string *)psVar7);
  std::__cxx11::string::append((char *)psVar7);
  pcVar9 = GetGlobalGenerator(this);
  cmGlobalNinjaGenerator::AddRule(pcVar9,&rule);
  std::__cxx11::string::~string((string *)&compilerLauncher);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&compileCmds);
  std::__cxx11::string::~string((string *)&cldeps);
  cmNinjaRule::~cmNinjaRule(&rule);
  std::__cxx11::string::~string((string *)&cmakeCmd);
  std::__cxx11::string::~string((string *)&launcher);
  std::__cxx11::string::~string((string *)&tdi);
  std::unique_ptr<cmRulePlaceholderExpander,_std::default_delete<cmRulePlaceholderExpander>_>::
  ~unique_ptr(&rulePlaceholderExpander);
  std::__cxx11::string::~string((string *)&responseFlag);
  std::__cxx11::string::~string((string *)&flags);
  return;
}

Assistant:

void cmNinjaTargetGenerator::WriteCompileRule(const std::string& lang)
{
  cmRulePlaceholderExpander::RuleVariables vars;
  vars.CMTargetName = this->GetGeneratorTarget()->GetName().c_str();
  vars.CMTargetType =
    cmState::GetTargetTypeName(this->GetGeneratorTarget()->GetType());
  vars.Language = lang.c_str();
  vars.Source = "$in";
  vars.Object = "$out";
  vars.Defines = "$DEFINES";
  vars.Includes = "$INCLUDES";
  vars.TargetPDB = "$TARGET_PDB";
  vars.TargetCompilePDB = "$TARGET_COMPILE_PDB";
  vars.ObjectDir = "$OBJECT_DIR";
  vars.ObjectFileDir = "$OBJECT_FILE_DIR";

  // For some cases we do an explicit preprocessor invocation.
  bool const explicitPP = this->NeedExplicitPreprocessing(lang);
  bool const needDyndep = this->NeedDyndep(lang);

  cmMakefile* mf = this->GetMakefile();

  std::string flags = "$FLAGS";

  std::string responseFlag;
  bool const lang_supports_response = lang != "RC";
  if (lang_supports_response && this->ForceResponseFile()) {
    std::string const responseFlagVar =
      "CMAKE_" + lang + "_RESPONSE_FILE_FLAG";
    responseFlag = this->Makefile->GetSafeDefinition(responseFlagVar);
    if (responseFlag.empty() && lang != "CUDA") {
      responseFlag = "@";
    }
  }

  std::unique_ptr<cmRulePlaceholderExpander> rulePlaceholderExpander(
    this->GetLocalGenerator()->CreateRulePlaceholderExpander());

  std::string const tdi = this->GetLocalGenerator()->ConvertToOutputFormat(
    ConvertToNinjaPath(this->GetTargetDependInfoPath(lang)),
    cmLocalGenerator::SHELL);

  std::string launcher;
  const char* val = this->GetLocalGenerator()->GetRuleLauncher(
    this->GetGeneratorTarget(), "RULE_LAUNCH_COMPILE");
  if (val && *val) {
    launcher = val;
    launcher += " ";
  }

  std::string const cmakeCmd =
    this->GetLocalGenerator()->ConvertToOutputFormat(
      cmSystemTools::GetCMakeCommand(), cmLocalGenerator::SHELL);

  if (explicitPP) {
    cmNinjaRule rule(this->LanguagePreprocessRule(lang));
    // Explicit preprocessing always uses a depfile.
    rule.DepType = ""; // no deps= for multiple outputs
    rule.DepFile = "$DEP_FILE";

    cmRulePlaceholderExpander::RuleVariables ppVars;
    ppVars.CMTargetName = vars.CMTargetName;
    ppVars.CMTargetType = vars.CMTargetType;
    ppVars.Language = vars.Language;
    ppVars.Object = "$out"; // for RULE_LAUNCH_COMPILE
    ppVars.PreprocessedSource = "$out";
    ppVars.DependencyFile = rule.DepFile.c_str();

    // Preprocessing uses the original source,
    // compilation uses preprocessed output.
    ppVars.Source = vars.Source;
    vars.Source = "$in";

    // Preprocessing and compilation use the same flags.
    std::string ppFlags = flags;

    // Move preprocessor definitions to the preprocessor rule.
    ppVars.Defines = vars.Defines;
    vars.Defines = "";

    // Copy include directories to the preprocessor rule.  The Fortran
    // compilation rule still needs them for the INCLUDE directive.
    ppVars.Includes = vars.Includes;

    // If using a response file, move defines, includes, and flags into it.
    if (!responseFlag.empty()) {
      rule.RspFile = "$RSP_FILE";
      rule.RspContent = " ";
      rule.RspContent += ppVars.Defines;
      rule.RspContent += " ";
      rule.RspContent += ppVars.Includes;
      rule.RspContent += " ";
      rule.RspContent += ppFlags;
      ppFlags = responseFlag + rule.RspFile;
      ppVars.Defines = "";
      ppVars.Includes = "";
    }

    ppVars.Flags = ppFlags.c_str();

    // Rule for preprocessing source file.
    std::vector<std::string> ppCmds;
    {
      // Lookup the explicit preprocessing rule.
      std::string ppVar = "CMAKE_" + lang;
      ppVar += "_PREPROCESS_SOURCE";
      cmSystemTools::ExpandListArgument(
        this->GetMakefile()->GetRequiredDefinition(ppVar), ppCmds);
    }

    for (std::string& i : ppCmds) {
      i = launcher + i;
      rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(),
                                                   i, ppVars);
    }

    // Run CMake dependency scanner on preprocessed output.
    {
      std::string ccmd = cmakeCmd;
      ccmd += " -E cmake_ninja_depends --tdi=";
      ccmd += tdi;
      ccmd += " --lang=";
      ccmd += lang;
      ccmd += " --pp=$out --dep=$DEP_FILE";
      if (needDyndep) {
        ccmd += " --obj=$OBJ_FILE --ddi=$DYNDEP_INTERMEDIATE_FILE";
      }
      ppCmds.emplace_back(std::move(ccmd));
    }
    rule.Command = this->GetLocalGenerator()->BuildCommandLine(ppCmds);

    // Write the rule for preprocessing file of the given language.
    rule.Comment = "Rule for preprocessing ";
    rule.Comment += lang;
    rule.Comment += " files.";
    rule.Description = "Building ";
    rule.Description += lang;
    rule.Description += " preprocessed $out";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  if (needDyndep) {
    // Write the rule for ninja dyndep file generation.
    cmNinjaRule rule(this->LanguageDyndepRule(lang));
    // Command line length is almost always limited -> use response file for
    // dyndep rules
    rule.RspFile = "$out.rsp";
    rule.RspContent = "$in";

    // Run CMake dependency scanner on the source file (using the preprocessed
    // source if that was performed).
    {
      std::vector<std::string> ddCmds;
      {
        std::string ccmd = cmakeCmd;
        ccmd += " -E cmake_ninja_dyndep --tdi=";
        ccmd += tdi;
        ccmd += " --lang=";
        ccmd += lang;
        ccmd += " --dd=$out ";
        ccmd += "@";
        ccmd += rule.RspFile;
        ddCmds.emplace_back(std::move(ccmd));
      }
      rule.Command = this->GetLocalGenerator()->BuildCommandLine(ddCmds);
    }
    rule.Comment = "Rule to generate ninja dyndep files for ";
    rule.Comment += lang;
    rule.Comment += ".";
    rule.Description = "Generating ";
    rule.Description += lang;
    rule.Description += " dyndep file $out";
    this->GetGlobalGenerator()->AddRule(rule);
  }

  cmNinjaRule rule(this->LanguageCompilerRule(lang));
  // If using a response file, move defines, includes, and flags into it.
  if (!responseFlag.empty()) {
    rule.RspFile = "$RSP_FILE";
    rule.RspContent = " ";
    rule.RspContent += vars.Defines;
    rule.RspContent += " ";
    rule.RspContent += vars.Includes;
    rule.RspContent += " ";
    rule.RspContent += flags;
    flags = responseFlag + rule.RspFile;
    vars.Defines = "";
    vars.Includes = "";
  }

  // Tell ninja dependency format so all deps can be loaded into a database
  std::string cldeps;
  if (explicitPP) {
    // The explicit preprocessing step will handle dependency scanning.
  } else if (this->NeedDepTypeMSVC(lang)) {
    rule.DepType = "msvc";
    rule.DepFile.clear();
    flags += " /showIncludes";
  } else if (mf->IsOn("CMAKE_NINJA_CMCLDEPS_" + lang)) {
    // For the MS resource compiler we need cmcldeps, but skip dependencies
    // for source-file try_compile cases because they are always fresh.
    if (!mf->GetIsSourceFileTryCompile()) {
      rule.DepType = "gcc";
      rule.DepFile = "$DEP_FILE";
      const std::string cl = mf->GetDefinition("CMAKE_C_COMPILER")
        ? mf->GetSafeDefinition("CMAKE_C_COMPILER")
        : mf->GetSafeDefinition("CMAKE_CXX_COMPILER");
      cldeps = "\"";
      cldeps += cmSystemTools::GetCMClDepsCommand();
      cldeps += "\" " + lang + " " + vars.Source + " $DEP_FILE $out \"";
      cldeps += mf->GetSafeDefinition("CMAKE_CL_SHOWINCLUDES_PREFIX");
      cldeps += "\" \"" + cl + "\" ";
    }
  } else {
    rule.DepType = "gcc";
    rule.DepFile = "$DEP_FILE";
    const std::string flagsName = "CMAKE_DEPFILE_FLAGS_" + lang;
    std::string depfileFlags = mf->GetSafeDefinition(flagsName);
    if (!depfileFlags.empty()) {
      cmSystemTools::ReplaceString(depfileFlags, "<DEPFILE>", "$DEP_FILE");
      cmSystemTools::ReplaceString(depfileFlags, "<OBJECT>", "$out");
      cmSystemTools::ReplaceString(depfileFlags, "<CMAKE_C_COMPILER>",
                                   mf->GetDefinition("CMAKE_C_COMPILER"));
      flags += " " + depfileFlags;
    }
  }

  vars.Flags = flags.c_str();
  vars.DependencyFile = rule.DepFile.c_str();

  // Rule for compiling object file.
  std::vector<std::string> compileCmds;
  if (lang == "CUDA") {
    std::string cmdVar;
    if (this->GeneratorTarget->GetPropertyAsBool(
          "CUDA_SEPARABLE_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_SEPARABLE_COMPILATION";
    } else if (this->GeneratorTarget->GetPropertyAsBool(
                 "CUDA_PTX_COMPILATION")) {
      cmdVar = "CMAKE_CUDA_COMPILE_PTX_COMPILATION";
    } else {
      cmdVar = "CMAKE_CUDA_COMPILE_WHOLE_COMPILATION";
    }
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  } else {
    const std::string cmdVar = "CMAKE_" + lang + "_COMPILE_OBJECT";
    const std::string& compileCmd = mf->GetRequiredDefinition(cmdVar);
    cmSystemTools::ExpandListArgument(compileCmd, compileCmds);
  }

  // See if we need to use a compiler launcher like ccache or distcc
  std::string compilerLauncher;
  if (!compileCmds.empty() &&
      (lang == "C" || lang == "CXX" || lang == "Fortran" || lang == "CUDA")) {
    std::string const clauncher_prop = lang + "_COMPILER_LAUNCHER";
    const char* clauncher = this->GeneratorTarget->GetProperty(clauncher_prop);
    if (clauncher && *clauncher) {
      compilerLauncher = clauncher;
    }
  }

  // Maybe insert an include-what-you-use runner.
  if (!compileCmds.empty() && (lang == "C" || lang == "CXX")) {
    std::string const iwyu_prop = lang + "_INCLUDE_WHAT_YOU_USE";
    const char* iwyu = this->GeneratorTarget->GetProperty(iwyu_prop);
    std::string const tidy_prop = lang + "_CLANG_TIDY";
    const char* tidy = this->GeneratorTarget->GetProperty(tidy_prop);
    std::string const cpplint_prop = lang + "_CPPLINT";
    const char* cpplint = this->GeneratorTarget->GetProperty(cpplint_prop);
    std::string const cppcheck_prop = lang + "_CPPCHECK";
    const char* cppcheck = this->GeneratorTarget->GetProperty(cppcheck_prop);
    if ((iwyu && *iwyu) || (tidy && *tidy) || (cpplint && *cpplint) ||
        (cppcheck && *cppcheck)) {
      std::string run_iwyu = cmakeCmd;
      run_iwyu += " -E __run_co_compile";
      if (!compilerLauncher.empty()) {
        // In __run_co_compile case the launcher command is supplied
        // via --launcher=<maybe-list> and consumed
        run_iwyu += " --launcher=";
        run_iwyu += this->LocalGenerator->EscapeForShell(compilerLauncher);
        compilerLauncher.clear();
      }
      if (iwyu && *iwyu) {
        run_iwyu += " --iwyu=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(iwyu);
      }
      if (tidy && *tidy) {
        run_iwyu += " --tidy=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(tidy);
      }
      if (cpplint && *cpplint) {
        run_iwyu += " --cpplint=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cpplint);
      }
      if (cppcheck && *cppcheck) {
        run_iwyu += " --cppcheck=";
        run_iwyu += this->GetLocalGenerator()->EscapeForShell(cppcheck);
      }
      if ((tidy && *tidy) || (cpplint && *cpplint) ||
          (cppcheck && *cppcheck)) {
        run_iwyu += " --source=$in";
      }
      run_iwyu += " -- ";
      compileCmds.front().insert(0, run_iwyu);
    }
  }

  // If compiler launcher was specified and not consumed above, it
  // goes to the beginning of the command line.
  if (!compileCmds.empty() && !compilerLauncher.empty()) {
    std::vector<std::string> args;
    cmSystemTools::ExpandListArgument(compilerLauncher, args, true);
    if (!args.empty()) {
      args[0] = this->LocalGenerator->ConvertToOutputFormat(
        args[0], cmOutputConverter::SHELL);
      for (std::string& i : cmMakeRange(args.begin() + 1, args.end())) {
        i = this->LocalGenerator->EscapeForShell(i);
      }
    }
    compileCmds.front().insert(0, cmJoin(args, " ") + " ");
  }

  if (!compileCmds.empty()) {
    compileCmds.front().insert(0, cldeps);
  }

  for (std::string& i : compileCmds) {
    i = launcher + i;
    rulePlaceholderExpander->ExpandRuleVariables(this->GetLocalGenerator(), i,
                                                 vars);
  }

  rule.Command = this->GetLocalGenerator()->BuildCommandLine(compileCmds);

  // Write the rule for compiling file of the given language.
  rule.Comment = "Rule for compiling ";
  rule.Comment += lang;
  rule.Comment += " files.";
  rule.Description = "Building ";
  rule.Description += lang;
  rule.Description += " object $out";
  this->GetGlobalGenerator()->AddRule(rule);
}